

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaAnalytic_mels.c
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  N_Vector y;
  N_Vector yp;
  long *plVar5;
  char *pcVar6;
  double dVar7;
  sunrealtype rtol;
  sunrealtype in_XMM2_Qa;
  void *ida_mem;
  sunrealtype t;
  SUNContext ctx;
  sunrealtype alpha;
  long nreLS;
  long ncfn;
  long netf;
  long nni;
  long nre;
  long nst;
  long local_88;
  double local_80;
  undefined8 local_78;
  undefined8 local_70;
  double local_68;
  long local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  long local_40;
  undefined8 local_38;
  
  local_70 = 0x4024000000000000;
  local_88 = 0;
  puts("\nAnalytical DAE test problem:");
  printf("    alpha = %g\n",local_70);
  printf("   reltol = %.1e\n",0x3f1a36e2eb1c432d);
  printf("   abstol = %.1e\n\n",0x3e112e0be826d695);
  uVar3 = SUNContext_Create(0,&local_78);
  if ((int)uVar3 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    y = (N_Vector)N_VNew_Serial(2,local_78);
    if (y == (N_Vector)0x0) {
      main_cold_4();
      return 1;
    }
    yp = (N_Vector)N_VClone(y);
    if (yp == (N_Vector)0x0) {
      main_cold_3();
      return 1;
    }
    analytical_solution(0.0,y,yp);
    local_88 = IDACreate(local_78);
    if (local_88 == 0) {
      main_cold_2();
      return 1;
    }
    uVar3 = IDAInit(0,local_88,fres,y,yp);
    if ((int)uVar3 < 0) {
      pcVar6 = "IDAInit";
    }
    else {
      uVar3 = IDASetUserData(local_88,&local_70);
      if ((int)uVar3 < 0) {
        pcVar6 = "IDASetUserData";
      }
      else {
        rtol = 1e-09;
        uVar3 = IDASStolerances(0x3f1a36e2eb1c432d,local_88);
        lVar2 = local_88;
        if ((int)uVar3 < 0) {
          pcVar6 = "IDASStolerances";
        }
        else {
          plVar5 = (long *)SUNLinSolNewEmpty(local_78);
          if (plVar5 == (long *)0x0) {
            plVar5 = (long *)0x0;
          }
          else {
            puVar1 = (undefined8 *)plVar5[1];
            *puVar1 = MatrixEmbeddedLSType;
            puVar1[8] = MatrixEmbeddedLSSolve;
            puVar1[0xe] = MatrixEmbeddedLSFree;
            *plVar5 = lVar2;
          }
          if (plVar5 == (long *)0x0) {
            main_cold_1();
            return 1;
          }
          uVar3 = IDASetLinearSolver(local_88,plVar5,0);
          if (-1 < (int)uVar3) {
            local_80 = 0.0;
            puts("        t          x1         x2");
            puts("   ----------------------------------");
            if (1e-15 < 1.0 - local_80) {
              dVar7 = 0.1;
              do {
                local_68 = dVar7;
                uVar3 = IDASolve(local_88,&local_80,y,yp,1);
                if ((int)uVar3 < 0) {
                  pcVar6 = "IDASolve";
                  goto LAB_00101939;
                }
                puVar1 = *(undefined8 **)((long)y->content + 0x10);
                printf("  %10.6f  %10.6f  %10.6f\n",local_80,*puVar1,puVar1[1]);
                in_XMM2_Qa = local_68 + 0.1;
                rtol = 1.0 - local_80;
                dVar7 = 1.0;
                if (in_XMM2_Qa <= 1.0) {
                  dVar7 = in_XMM2_Qa;
                }
              } while (1e-15 < rtol);
            }
            puts("   ----------------------------------");
            uVar3 = IDAGetNumSteps(local_88,&local_38);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","IDAGetNumSteps",
                      (ulong)uVar3);
            }
            uVar3 = IDAGetNumResEvals(local_88,&local_40);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","IDAGetNumResEvals"
                      ,(ulong)uVar3);
            }
            uVar3 = IDAGetNumNonlinSolvIters(local_88,&local_48);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "IDAGetNumNonlinSolvIters",(ulong)uVar3);
            }
            uVar3 = IDAGetNumErrTestFails(local_88,&local_50);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "IDAGetNumErrTestFails",(ulong)uVar3);
            }
            uVar3 = IDAGetNumNonlinSolvConvFails(local_88,&local_58);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "IDAGetNumNonlinSolvConvFails",(ulong)uVar3);
            }
            uVar3 = IDAGetNumLinResEvals(local_88,&local_60);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "IDAGetNumLinResEvals",(ulong)uVar3);
            }
            puts("\nFinal Solver Statistics: \n");
            printf("Number of steps                    = %ld\n",local_38);
            printf("Number of residual evaluations     = %ld\n",local_60 + local_40);
            printf("Number of nonlinear iterations     = %ld\n",local_48);
            printf("Number of error test failures      = %ld\n",local_50);
            printf("Number of nonlinear conv. failures = %ld\n",local_58);
            iVar4 = check_ans(y,local_80,rtol,in_XMM2_Qa);
            IDAFree(&local_88);
            SUNLinSolFree(plVar5);
            N_VDestroy(y);
            N_VDestroy(yp);
            SUNContext_Free(&local_78);
            return iVar4;
          }
          pcVar6 = "IDASetLinearSolver";
        }
      }
    }
  }
LAB_00101939:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar6,(ulong)uVar3);
  return 1;
}

Assistant:

int main(void)
{
  /* SUNDIALS context object */
  SUNContext ctx;

  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(1.0);    /* final time */
  sunrealtype dTout  = SUN_RCONST(0.1);    /* time between outputs */
  sunindextype NEQ   = 2;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-4); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-9);
  sunrealtype alpha  = SUN_RCONST(10.0); /* stiffness parameter */

  /* general problem variables */
  int retval;                /* reusable error-checking flag */
  N_Vector yy        = NULL; /* empty vector for storing solution */
  N_Vector yp        = NULL; /* empty vector for storing solution derivative */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* ida_mem      = NULL; /* empty IDA memory structure */
  sunrealtype t, tout;
  long int nst, nre, nni, netf, ncfn, nreLS;

  /* Initial diagnostics output */
  printf("\nAnalytical DAE test problem:\n");
  printf("    alpha = %" GSYM "\n", alpha);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Initialize data structures */
  yy = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return 1; }
  yp = N_VClone(yy); /* Create serial vector for solution derivative */
  if (check_retval((void*)yp, "N_VClone", 0)) { return 1; }
  analytical_solution(T0, yy, yp); /* Specify initial conditions */

  /* Call IDACreate and IDAInit to initialize IDA memory */
  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }
  retval = IDAInit(ida_mem, fres, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Set routines */
  retval = IDASetUserData(ida_mem, (void*)&alpha);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }
  retval = IDASStolerances(ida_mem, reltol, abstol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create custom matrix-embedded linear solver */
  LS = MatrixEmbeddedLS(ida_mem, ctx);
  if (check_retval((void*)LS, "MatrixEmbeddedLS", 0)) { return 1; }

  /* Attach the linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, NULL);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* In loop, call IDASolve, print results, and test for error.
     Stops when the final time has been reached. */
  t    = T0;
  tout = T0 + dTout;
  printf("        t          x1         x2\n");
  printf("   ----------------------------------\n");
  while (Tf - t > 1.0e-15)
  {
    retval = IDASolve(ida_mem, tout, &t, yy, yp, IDA_NORMAL); /* call integrator */
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(yy, 0), NV_Ith_S(yy, 1)); /* access/print solution */
    if (retval >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ----------------------------------\n");

  /* Get/print some final statistics on how the solve progressed */
  retval = IDAGetNumSteps(ida_mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetNumResEvals(ida_mem, &nre);
  check_retval(&retval, "IDAGetNumResEvals", 1);
  retval = IDAGetNumNonlinSolvIters(ida_mem, &nni);
  check_retval(&retval, "IDAGetNumNonlinSolvIters", 1);
  retval = IDAGetNumErrTestFails(ida_mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);
  retval = IDAGetNumNonlinSolvConvFails(ida_mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);
  retval = IDAGetNumLinResEvals(ida_mem, &nreLS);
  check_retval(&retval, "IDAGetNumLinResEvals", 1);

  printf("\nFinal Solver Statistics: \n\n");
  printf("Number of steps                    = %ld\n", nst);
  printf("Number of residual evaluations     = %ld\n", nre + nreLS);
  printf("Number of nonlinear iterations     = %ld\n", nni);
  printf("Number of error test failures      = %ld\n", netf);
  printf("Number of nonlinear conv. failures = %ld\n", ncfn);

  /* check the solution error */
  retval = check_ans(yy, t, reltol, abstol);

  /* Clean up and return */
  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  N_VDestroy(yy);
  N_VDestroy(yp);
  SUNContext_Free(&ctx);

  return (retval);
}